

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_acl_nfs4.c
# Opt level: O2

void set_acls(archive_entry *ae,acl_t *acls,int n)

{
  ulong uVar1;
  ulong uVar2;
  
  archive_entry_acl_clear(ae);
  uVar1 = 0;
  uVar2 = (ulong)(uint)n;
  if (n < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 * 0x18 - uVar1 != 0; uVar1 = uVar1 + 0x18) {
    archive_entry_acl_add_entry
              (ae,*(wchar_t *)((long)&acls->type + uVar1),*(wchar_t *)((long)&acls->permset + uVar1)
               ,*(wchar_t *)((long)&acls->tag + uVar1),*(wchar_t *)((long)&acls->qual + uVar1),
               *(char **)((long)&acls->name + uVar1));
  }
  return;
}

Assistant:

static void
set_acls(struct archive_entry *ae, struct acl_t *acls, int n)
{
	int i;

	archive_entry_acl_clear(ae);
	for (i = 0; i < n; i++) {
		failure("type=%d, permset=%d, tag=%d, qual=%d name=%s",
		    acls[i].type, acls[i].permset, acls[i].tag,
		    acls[i].qual, acls[i].name);
		assertEqualInt(ARCHIVE_OK,
		    archive_entry_acl_add_entry(ae,
			acls[i].type, acls[i].permset, acls[i].tag,
			acls[i].qual, acls[i].name));
	}
}